

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_perftest.cc
# Opt level: O1

int main(void)

{
  bool bVar1;
  LoadStatus LVar2;
  uint uVar3;
  int64_t iVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  int delta;
  vector<int,_std::allocator<int>_> times;
  string err;
  BuildLog log;
  uint local_fc;
  string local_f8;
  uint *local_d8;
  iterator iStack_d0;
  int *local_c8;
  string local_b8;
  BuildLog local_98;
  
  local_d8 = (uint *)0x0;
  iStack_d0._M_current = (int *)0x0;
  local_c8 = (int *)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  bVar1 = WriteTestData(&local_b8);
  if (bVar1) {
    BuildLog::BuildLog(&local_98);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"BuildLogPerfTest-tempfile","");
    LVar2 = BuildLog::Load(&local_98,&local_f8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (LVar2 == LOAD_ERROR) {
      main_cold_2();
    }
    local_fc = (uint)(LVar2 == LOAD_ERROR);
    BuildLog::~BuildLog(&local_98);
    if (LVar2 != LOAD_ERROR) {
      bVar1 = false;
      uVar11 = 0;
      do {
        iVar4 = GetTimeMillis();
        BuildLog::BuildLog(&local_98);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"BuildLogPerfTest-tempfile","");
        LVar2 = BuildLog::Load(&local_98,&local_f8,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (LVar2 == LOAD_ERROR) {
          main_cold_3();
          local_fc = 1;
        }
        else {
          iVar5 = GetTimeMillis();
          uVar3 = (int)iVar5 - (int)iVar4;
          local_f8._M_dataplus._M_p._0_4_ = uVar3;
          printf("%dms\n",(ulong)uVar3);
          if (iStack_d0._M_current == local_c8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,(int *)&local_f8);
          }
          else {
            *iStack_d0._M_current = (uint)local_f8._M_dataplus._M_p;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
        }
        BuildLog::~BuildLog(&local_98);
        if (LVar2 == LOAD_ERROR) break;
        bVar1 = 3 < uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 5);
      if (bVar1) {
        uVar6 = (long)iStack_d0._M_current - (long)local_d8 >> 2;
        uVar7 = (ulong)*local_d8;
        uVar8 = uVar7;
        if ((uint *)iStack_d0._M_current == local_d8) {
          fVar12 = 0.0;
        }
        else {
          fVar12 = 0.0;
          lVar9 = 0;
          uVar10 = uVar7;
          do {
            uVar11 = local_d8[lVar9];
            uVar7 = uVar10;
            if ((int)uVar10 < (int)uVar11) {
              uVar7 = (ulong)uVar11;
            }
            if ((int)uVar11 < (int)uVar8) {
              uVar8 = (ulong)uVar11;
              uVar7 = uVar10;
            }
            fVar12 = fVar12 + (float)(int)uVar11;
            lVar9 = lVar9 + 1;
            uVar10 = uVar7;
          } while (uVar6 + (uVar6 == 0) != lVar9);
        }
        printf("min %dms  max %dms  avg %.1fms\n",SUB84((double)(fVar12 / (float)uVar6),0),uVar8,
               uVar7);
        unlink("BuildLogPerfTest-tempfile");
        local_fc = 0;
      }
    }
  }
  else {
    main_cold_1();
    local_fc = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if (local_d8 != (uint *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  return local_fc;
}

Assistant:

int main() {
  vector<int> times;
  string err;

  if (!WriteTestData(&err)) {
    fprintf(stderr, "Failed to write test data: %s\n", err.c_str());
    return 1;
  }

  {
    // Read once to warm up disk cache.
    BuildLog log;
    if (!log.Load(kTestFilename, &err)) {
      fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
      return 1;
    }
  }
  const int kNumRepetitions = 5;
  for (int i = 0; i < kNumRepetitions; ++i) {
    int64_t start = GetTimeMillis();
    BuildLog log;
    if (!log.Load(kTestFilename, &err)) {
      fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
      return 1;
    }
    int delta = (int)(GetTimeMillis() - start);
    printf("%dms\n", delta);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());

  unlink(kTestFilename);

  return 0;
}